

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O1

error_code __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::assign
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          protocol_type *protocol,native_handle_type *native_socket,error_code *ec)

{
  int iVar1;
  error_category *peVar2;
  error_code eVar3;
  
  if ((impl->super_base_implementation_type).socket_ == -1) {
    iVar1 = epoll_reactor::register_descriptor
                      ((this->super_reactive_socket_service_base).reactor_,*native_socket,
                       &(impl->super_base_implementation_type).reactor_data_);
    if (iVar1 != 0) {
      if (system_category()::instance == '\0') {
        assign();
      }
      ec->_M_value = iVar1;
      ec->_M_cat = (error_category *)&system_category()::instance;
      goto LAB_00123f97;
    }
    (impl->super_base_implementation_type).socket_ = *native_socket;
    (impl->super_base_implementation_type).state_ = 'P';
    peVar2 = (error_category *)std::_V2::system_category();
    ec->_M_value = 0;
    ec->_M_cat = peVar2;
  }
  else {
    std::error_code::operator=(ec,already_open);
    if (ec->_M_value != 0) goto LAB_00123f97;
  }
  (impl->protocol_).family_ = protocol->family_;
LAB_00123f97:
  eVar3._4_4_ = 0;
  eVar3._M_value = ec->_M_value;
  eVar3._M_cat = ec->_M_cat;
  return eVar3;
}

Assistant:

asio::error_code assign(implementation_type& impl,
      const protocol_type& protocol, const native_handle_type& native_socket,
      asio::error_code& ec)
  {
    if (!do_assign(impl, protocol.type(), native_socket, ec))
      impl.protocol_ = protocol;
    return ec;
  }